

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.cpp
# Opt level: O3

string * __thiscall Record::toString_abi_cxx11_(string *__return_storage_ptr__,Record *this)

{
  undefined8 *puVar1;
  uint uVar2;
  uint __val;
  long lVar3;
  uint uVar4;
  undefined8 *puVar5;
  long *plVar6;
  uint uVar7;
  pointer *ppcVar8;
  size_type *psVar9;
  ulong uVar10;
  undefined8 uVar11;
  pointer pcVar12;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  pointer *local_d0;
  long local_c8;
  pointer local_c0;
  long lStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  size_type *local_50;
  string __str;
  
  pcVar12 = (this->tconst)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar12,pcVar12 + (this->tconst)._M_string_length);
  std::__cxx11::string::append((char *)&local_70);
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_f0,vsnprintf,0x3a,"%f",SUB84((double)this->averageRating,0));
  uVar10 = 0xf;
  if (local_70 != local_60) {
    uVar10 = local_60[0];
  }
  if (uVar10 < local_f0._M_string_length + local_68) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar11 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_f0._M_string_length + local_68) goto LAB_0010931b;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_0010931b:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
  }
  local_90 = &local_80;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar5[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar5;
  }
  local_88 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  ppcVar8 = (pointer *)(plVar6 + 2);
  if ((pointer *)*plVar6 == ppcVar8) {
    local_c0 = *ppcVar8;
    lStack_b8 = plVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *ppcVar8;
    local_d0 = (pointer *)*plVar6;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)ppcVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  uVar2 = this->numVotes;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar4 = 4;
    do {
      __len = uVar4;
      uVar7 = (uint)uVar10;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_00109446;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_00109446;
      }
      if (uVar7 < 10000) goto LAB_00109446;
      uVar10 = uVar10 / 10000;
      uVar4 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_00109446:
  local_50 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_50),__len,__val);
  pcVar12 = (pointer)0xf;
  if (local_d0 != &local_c0) {
    pcVar12 = local_c0;
  }
  if (pcVar12 < __str._M_dataplus._M_p + local_c8) {
    pcVar12 = (pointer)0xf;
    if (local_50 != &__str._M_string_length) {
      pcVar12 = (pointer)__str._M_string_length;
    }
    if (__str._M_dataplus._M_p + local_c8 <= pcVar12) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_d0);
      goto LAB_001094d8;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_50);
LAB_001094d8:
  local_b0 = &local_a0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar5[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar5;
  }
  local_a8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar9) {
    lVar3 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Record::toString() {
    return tconst + "," + std::to_string(averageRating) + "," + std::to_string(numVotes) + "\n";
}